

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keygen.c
# Opt level: O0

int ulp_generate_key_pair
              (size_t n,size_t l,uint64_t sk,uint64_t se,uint64_t q,ulp_public_key **pub_key_p,
              ulp_private_key **priv_key_p)

{
  int iVar1;
  ulp_public_key *puVar2;
  ulp_private_key *buffer;
  void *__ptr;
  uint64_t uVar3;
  uint64_t in_RCX;
  long in_RDX;
  ulong in_RSI;
  ulong in_RDI;
  ulong in_R8;
  undefined8 *in_R9;
  undefined8 *in_stack_00000008;
  size_t i_1;
  size_t k;
  size_t j;
  size_t i;
  int err;
  uint64_t *SA;
  ulp_private_key *priv_key;
  ulp_public_key *pub_key;
  size_t in_stack_ffffffffffffff80;
  uint64_t q_00;
  uint64_t in_stack_ffffffffffffff88;
  ulong uVar4;
  uint64_t a;
  ulong local_68;
  ulong local_60;
  uint in_stack_ffffffffffffffa8;
  int iVar5;
  int local_4;
  
  if ((((in_RDI == 0) || (in_RSI == 0)) || (in_RDX == 0)) ||
     (((in_RCX == 0 || (in_R8 == 0)) ||
      ((in_R9 == (undefined8 *)0x0 ||
       ((in_stack_00000008 == (undefined8 *)0x0 || (0x7fffffffffffffff < in_R8)))))))) {
    local_4 = -2;
  }
  else {
    puVar2 = ulp_alloc_public_key(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    buffer = ulp_alloc_private_key(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    __ptr = calloc(in_RSI * in_RDI,8);
    if (((puVar2 != (ulp_public_key *)0x0) && (buffer != (ulp_private_key *)0x0)) &&
       (__ptr != (void *)0x0)) {
      puVar2->se = in_RCX;
      puVar2->q = in_R8;
      buffer->q = in_R8;
      iVar5 = 0;
      iVar1 = get_random_numbers(&buffer->n,(size_t)__ptr,(ulong)in_stack_ffffffffffffffa8);
      iVar1 = iVar1 + iVar5;
      iVar5 = get_random_numbers(&buffer->n,(size_t)__ptr,CONCAT44(iVar1,in_stack_ffffffffffffffa8))
      ;
      iVar5 = iVar5 + iVar1;
      iVar1 = get_random_numbers(&buffer->n,(size_t)__ptr,CONCAT44(iVar5,in_stack_ffffffffffffffa8))
      ;
      if (iVar1 + iVar5 == 0) {
        for (local_60 = 0; local_60 < in_RSI; local_60 = local_60 + 1) {
          for (local_68 = 0; local_68 < in_RDI; local_68 = local_68 + 1) {
            for (a = 0; a < in_RDI; a = a + 1) {
              q_00 = *(uint64_t *)((long)__ptr + (local_60 * in_RDI + local_68) * 8);
              uVar3 = mulmod(a,in_stack_ffffffffffffff88,q_00);
              *(ulong *)((long)__ptr + (local_60 * in_RDI + local_68) * 8) = (q_00 + uVar3) % in_R8;
            }
          }
        }
        for (uVar4 = 0; uVar4 < in_RSI * in_RDI; uVar4 = uVar4 + 1) {
          puVar2->P[uVar4] =
               ((puVar2->P[uVar4] + in_R8) - *(long *)((long)__ptr + uVar4 * 8)) % in_R8;
        }
        free(__ptr);
        *in_R9 = puVar2;
        *in_stack_00000008 = buffer;
        return 0;
      }
    }
    ulp_free_public_key((ulp_public_key *)0x101c9b);
    ulp_free_private_key((ulp_private_key *)0x101ca5);
    free(__ptr);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int ulp_generate_key_pair(size_t n, size_t l, uint64_t sk, uint64_t se, uint64_t q, ulp_public_key** pub_key_p, ulp_private_key** priv_key_p) {

    if(n == 0 || l == 0 || sk == 0 || se == 0 || q == 0 || pub_key_p == NULL || priv_key_p == NULL || q >= 0x8000000000000000)
        return -2;

    // allocate memory for keys
    ulp_public_key* pub_key = ulp_alloc_public_key(n, l);
    ulp_private_key* priv_key = ulp_alloc_private_key(n, l);
    uint64_t* SA = calloc(l*n, sizeof(q));
    if(pub_key == NULL || priv_key == NULL || SA == NULL)
        goto fail;

    // store parameters in key structs
    pub_key->se = se;
    pub_key->q = q;
    priv_key->q = q;

    // sample random data
    int err = 0;
    err += get_random_numbers(pub_key->A, n*n, q);
    err += get_random_numbers(pub_key->P, l*n, sk);
    err += get_random_numbers(priv_key->S, l*n, sk);
    if(err != 0)
        goto fail;

    // S*A
    for(size_t i = 0; i < l; i++) {
        for(size_t j = 0; j < n; j++) {
            for(size_t k = 0; k < n; k++) {
                SA[i*n+j] = (SA[i*n+j] + mulmod(priv_key->S[i*n+k], pub_key->A[k*n+j], q)) % q;
            }
        }
    }

    // P = E - S*A
    for(size_t i = 0; i < l*n; i++) {
        pub_key->P[i] = (pub_key->P[i] + q - SA[i]) % q;
    }

    // exit properly
    free(SA);
    *pub_key_p = pub_key;
    *priv_key_p = priv_key;
    return 0;


    // on failure, do cleanup
    fail:
        ulp_free_public_key(pub_key);
        ulp_free_private_key(priv_key);
        free(SA);
        return -1;

}